

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

gboolean media_player2_player_proxy_get_shuffle(MediaPlayer2Player *object)

{
  GType GVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  gboolean local_24;
  gboolean value;
  GVariant *variant;
  MediaPlayer2PlayerProxy *proxy;
  MediaPlayer2Player *object_local;
  
  GVar1 = media_player2_player_proxy_get_type();
  uVar2 = g_type_check_instance_cast(object,GVar1);
  local_24 = 0;
  uVar3 = g_dbus_proxy_get_type();
  uVar2 = g_type_check_instance_cast(uVar2,uVar3);
  lVar4 = g_dbus_proxy_get_cached_property(uVar2,"Shuffle");
  if (lVar4 != 0) {
    local_24 = g_variant_get_boolean(lVar4);
    g_variant_unref(lVar4);
  }
  return local_24;
}

Assistant:

static gboolean 
media_player2_player_proxy_get_shuffle (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerProxy *proxy = MEDIA_PLAYER2_PLAYER_PROXY (object);
  GVariant *variant;
  gboolean value = 0;
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (proxy), "Shuffle");
  if (variant != NULL)
    {
      value = g_variant_get_boolean (variant);
      g_variant_unref (variant);
    }
  return value;
}